

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O3

DiagnosticStream * __thiscall
spvtools::val::ValidationState_t::diag
          (DiagnosticStream *__return_storage_ptr__,ValidationState_t *this,spv_result_t error_code,
          Instruction *inst)

{
  spv_const_context psVar1;
  spv_position_t position;
  spv_position_t position_00;
  spv_position_t position_01;
  uint uVar2;
  uint uVar3;
  string disassembly;
  undefined4 in_stack_fffffffffffffd5c;
  uint32_t in_stack_fffffffffffffd60;
  string local_288;
  undefined8 local_268;
  undefined8 uStack_260;
  size_t local_258;
  undefined8 local_248;
  undefined8 uStack_240;
  size_t local_238;
  undefined8 local_228;
  undefined8 uStack_220;
  size_t local_218;
  _Any_data local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8 [28];
  
  if (error_code == SPV_WARNING) {
    uVar2 = this->num_of_warnings_;
    uVar3 = this->max_num_of_warnings_;
    if (uVar2 == uVar3) {
      local_228 = 0;
      uStack_220 = 0;
      local_218 = 0;
      psVar1 = this->context_;
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"");
      in_stack_fffffffffffffd5c = (undefined4)((ulong)local_228 >> 0x20);
      in_stack_fffffffffffffd60 = (uint32_t)uStack_220;
      position.column._0_4_ = in_stack_fffffffffffffd60;
      position.line = local_228;
      position.column._4_4_ = (int)((ulong)uStack_220 >> 0x20);
      position.index = local_218;
      DiagnosticStream::DiagnosticStream
                ((DiagnosticStream *)&local_208,position,&psVar1->consumer,&local_288,SPV_WARNING);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_208._M_pod_data,"Other warnings have been suppressed.\n",0x25);
      DiagnosticStream::~DiagnosticStream((DiagnosticStream *)&local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      uVar2 = this->num_of_warnings_;
      uVar3 = this->max_num_of_warnings_;
    }
    if (uVar3 <= uVar2) {
      local_248 = 0;
      uStack_240 = 0;
      local_238 = 0;
      local_1f8[0]._M_allocated_capacity = (code *)0x0;
      local_1f8[0]._8_8_ = 0;
      local_208._M_unused._M_object = (void *)0x0;
      local_208._8_8_ = 0;
      local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_288,"");
      position_01.column._0_4_ = (int)uStack_240;
      position_01.line = local_248;
      position_01.column._4_4_ = (int)((ulong)uStack_240 >> 0x20);
      position_01.index = local_238;
      DiagnosticStream::DiagnosticStream
                (__return_storage_ptr__,position_01,(MessageConsumer *)&local_208,&local_288,
                 SPV_WARNING);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_288._M_dataplus._M_p != &local_288.field_2) {
        operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
      }
      if ((code *)local_1f8[0]._0_8_ == (code *)0x0) {
        return __return_storage_ptr__;
      }
      (*(code *)local_1f8[0]._0_8_)(&local_208,&local_208,3);
      return __return_storage_ptr__;
    }
    this->num_of_warnings_ = uVar2 + 1;
  }
  local_208._8_8_ = 0;
  local_1f8[0]._M_allocated_capacity = local_1f8[0]._M_allocated_capacity & 0xffffffffffffff00;
  local_208._M_unused._M_object = local_1f8;
  if (inst == (Instruction *)0x0) {
    local_258 = 0;
  }
  else {
    spvInstructionBinaryToText_abi_cxx11_
              (&local_288,(spvtools *)(ulong)this->context_->target_env,
               (spv_target_env)(inst->inst_).words,(uint32_t *)(ulong)(inst->inst_).num_words,
               (size_t)this->words_,(uint32_t *)this->num_words_,
               CONCAT44(in_stack_fffffffffffffd5c,0x60),in_stack_fffffffffffffd60);
    std::__cxx11::string::operator=((string *)local_208._M_pod_data,(string *)&local_288);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_288._M_dataplus._M_p != &local_288.field_2) {
      operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
    }
    local_258 = inst->line_num_;
  }
  uStack_260 = 0;
  local_268 = 0;
  position_00.index = local_258;
  position_00.line = 0;
  position_00.column = 0;
  DiagnosticStream::DiagnosticStream
            (__return_storage_ptr__,position_00,&this->context_->consumer,(string *)&local_208,
             error_code);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_unused._0_8_ != local_1f8) {
    operator_delete(local_208._M_unused._M_object,local_1f8[0]._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

DiagnosticStream ValidationState_t::diag(spv_result_t error_code,
                                         const Instruction* inst) {
  if (error_code == SPV_WARNING) {
    if (num_of_warnings_ == max_num_of_warnings_) {
      DiagnosticStream({0, 0, 0}, context_->consumer, "", error_code)
          << "Other warnings have been suppressed.\n";
    }
    if (num_of_warnings_ >= max_num_of_warnings_) {
      return DiagnosticStream({0, 0, 0}, nullptr, "", error_code);
    }
    ++num_of_warnings_;
  }

  std::string disassembly;
  if (inst) disassembly = Disassemble(*inst);

  return DiagnosticStream({0, 0, inst ? inst->LineNum() : 0},
                          context_->consumer, disassembly, error_code);
}